

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O2

lts_20240722 *
absl::lts_20240722::log_internal::FormatLogMessage_abi_cxx11_
          (LogSeverity severity,CivilSecond civil_second,Duration subsecond,Tid tid,
          string_view basename,int line,PrefixFormat format,string_view message)

{
  char *args;
  undefined4 in_register_0000003c;
  Duration DVar1;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  long local_48;
  FormatSpec<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char>,_int,_const_char_*,_std::basic_string_view<char>_>
  local_40;
  
  DVar1.rep_hi_.hi_ = (uint32_t)((ulong)register0x00000080 >> 0x20);
  DVar1.rep_hi_.lo_ = subsecond.rep_lo_;
  local_40.super_type.spec_.data_ = "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s";
  local_40.super_type.spec_.size_ = 0x2e;
  args = LogSeverityName((LogSeverity)civil_second.f_.y);
  local_54 = (int)(char)subsecond.rep_hi_.lo_;
  local_58 = (int)subsecond.rep_hi_.lo_._1_1_;
  local_5c = (int)subsecond.rep_hi_.lo_._2_1_;
  local_60 = (int)subsecond.rep_hi_.lo_ >> 0x18;
  local_64 = subsecond.rep_hi_._1_4_ >> 0x18;
  DVar1.rep_lo_ = tid;
  local_48 = absl::lts_20240722::ToInt64Microseconds(DVar1);
  local_50 = "";
  if ((int)message._M_len == 1) {
    local_50 = "RAW: ";
  }
  StrFormat<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_int,_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((lts_20240722 *)CONCAT44(in_register_0000003c,severity),&local_40,args,&local_54,
             &local_58,&local_5c,&local_60,&local_64,&local_48,(int *)&basename,
             (basic_string_view<char,_std::char_traits<char>_> *)&basename._M_str,(int *)&format,
             &local_50,(basic_string_view<char,_std::char_traits<char>_> *)&message._M_str);
  return (lts_20240722 *)CONCAT44(in_register_0000003c,severity);
}

Assistant:

std::string FormatLogMessage(absl::LogSeverity severity,
                             absl::CivilSecond civil_second,
                             absl::Duration subsecond, log_internal::Tid tid,
                             absl::string_view basename, int line,
                             PrefixFormat format, absl::string_view message) {
  return absl::StrFormat(
      "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s",
      absl::LogSeverityName(severity)[0], civil_second.month(),
      civil_second.day(), civil_second.hour(), civil_second.minute(),
      civil_second.second(), absl::ToInt64Microseconds(subsecond), tid,
      basename, line, format == PrefixFormat::kRaw ? "RAW: " : "", message);
}